

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.h
# Opt level: O2

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxWeightST(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *old)

{
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  
  (this->
  super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_name = (old->
             super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_name;
  (this->
  super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->
  super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->
  super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SPxStarter = (_func_int **)&PTR__SPxWeightST_00542d48;
  DataArray<int>::DataArray(&this->forbidden,&old->forbidden);
  this_00 = &this->rowWeight;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Array(this_00,&old->rowWeight);
  this_01 = &this->colWeight;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Array(this_01,&old->colWeight);
  DataArray<bool>::DataArray(&this->rowRight,&old->rowRight);
  DataArray<bool>::DataArray(&this->colUp,&old->colUp);
  if (old->weight == &old->colWeight) {
    this->weight = this_01;
    this->coWeight = this_00;
  }
  else if (old->weight == &old->rowWeight) {
    this->weight = this_00;
    this->coWeight = this_01;
  }
  else {
    this->weight = (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0;
    this->coWeight =
         (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
  }
  return;
}

Assistant:

SPxWeightST(const SPxWeightST& old)
      : SPxStarter<R>(old)
      , forbidden(old.forbidden)
      , rowWeight(old.rowWeight)
      , colWeight(old.colWeight)
      , rowRight(old.rowRight)
      , colUp(old.colUp)
   {
      if(old.weight == &old.colWeight)
      {
         weight   = &colWeight;
         coWeight = &rowWeight;
      }
      else if(old.weight == &old.rowWeight)
      {
         weight   = &rowWeight;
         coWeight = &colWeight;
      }
      else  // old.weight and old.coWeight are not set correctly, do nothing.
      {
         weight = nullptr;
         coWeight = nullptr;
      }

      assert(isConsistent());
   }